

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

opStatus __thiscall
llvm::detail::DoubleAPFloat::convertToInteger
          (DoubleAPFloat *this,MutableArrayRef<unsigned_long> Input,uint Width,bool IsSigned,
          roundingMode RM,bool *IsExact)

{
  opStatus oVar1;
  DoubleAPFloat local_60;
  undefined1 local_50 [8];
  IEEEFloat local_48;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    bitcastToAPInt(&local_60);
    IEEEFloat::IEEEFloat
              ((IEEEFloat *)(local_50 + 8),(fltSemantics *)semPPCDoubleDoubleLegacy,
               (APInt *)&local_60);
    oVar1 = APFloat::convertToInteger((APFloat *)local_50,Input,Width,IsSigned,RM,IsExact);
    APFloat::Storage::~Storage((Storage *)(local_50 + 8));
    if ((0x40 < (uint)local_60.Floats._M_t.
                      super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                      .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl) &&
       (local_60.Semantics != (fltSemantics *)0x0)) {
      operator_delete__(local_60.Semantics);
    }
    return oVar1;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x10cf,
                "APFloat::opStatus llvm::detail::DoubleAPFloat::convertToInteger(MutableArrayRef<integerPart>, unsigned int, bool, roundingMode, bool *) const"
               );
}

Assistant:

APFloat::opStatus
DoubleAPFloat::convertToInteger(MutableArrayRef<integerPart> Input,
                                unsigned int Width, bool IsSigned,
                                roundingMode RM, bool *IsExact) const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  return APFloat(semPPCDoubleDoubleLegacy, bitcastToAPInt())
      .convertToInteger(Input, Width, IsSigned, RM, IsExact);
}